

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

WebSocketPipe * kj::newWebSocketPipe(void)

{
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *params;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *params_1;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> *pOVar1;
  Own<kj::WebSocket,decltype(nullptr)> *in_RDI;
  undefined1 local_80 [8];
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> end2;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> local_60;
  undefined1 local_50 [8];
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> end1;
  undefined1 local_30 [8];
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> pipe2;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> pipe1;
  
  rc<kj::(anonymous_namespace)::WebSocketPipeImpl>();
  rc<kj::(anonymous_namespace)::WebSocketPipeImpl>();
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::addRef(&local_60);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::addRef
            ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&end2.ptr);
  heap<kj::(anonymous_namespace)::WebSocketPipeEnd,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
            ((kj *)local_50,&local_60,(Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&end2.ptr)
  ;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc
            ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&end2.ptr);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc(&local_60);
  params = mv<kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
                     ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)local_30);
  params_1 = mv<kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
                       ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&pipe2.own.ptr);
  heap<kj::(anonymous_namespace)::WebSocketPipeEnd,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
            ((kj *)local_80,params,params_1);
  pOVar1 = mv<kj::Own<kj::(anonymous_namespace)::WebSocketPipeEnd,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> *)local_50);
  Own<kj::WebSocket,decltype(nullptr)>::Own<kj::(anonymous_namespace)::WebSocketPipeEnd,void>
            (in_RDI,pOVar1);
  pOVar1 = mv<kj::Own<kj::(anonymous_namespace)::WebSocketPipeEnd,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> *)local_80);
  Own<kj::WebSocket,decltype(nullptr)>::Own<kj::(anonymous_namespace)::WebSocketPipeEnd,void>
            (in_RDI + 0x10,pOVar1);
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> *)local_80);
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> *)local_50);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc
            ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)local_30);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc
            ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&pipe2.own.ptr);
  return (WebSocketPipe *)in_RDI;
}

Assistant:

WebSocketPipe newWebSocketPipe() {
  auto pipe1 = kj::rc<WebSocketPipeImpl>();
  auto pipe2 = kj::rc<WebSocketPipeImpl>();

  auto end1 = kj::heap<WebSocketPipeEnd>(pipe1.addRef(), pipe2.addRef());
  auto end2 = kj::heap<WebSocketPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));

  return { { kj::mv(end1), kj::mv(end2) } };
}